

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O1

void Fraig_ManProveMiter(Fraig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Fraig_NodeVec_t *pFVar4;
  Fraig_Node_t *pFVar5;
  long lVar6;
  timespec ts;
  timespec local_30;
  
  if (p->fTryProve != 0) {
    clock_gettime(3,&local_30);
    pFVar4 = p->vOutputs;
    if (0 < pFVar4->nSize) {
      lVar6 = 0;
      do {
        pFVar5 = (Fraig_Node_t *)((ulong)pFVar4->pArray[lVar6] & 0xfffffffffffffffe);
        if (((p->pConst1 != pFVar5) &&
            (iVar2 = Fraig_CompareSimInfo(pFVar5,p->pConst1,p->nWordsRand,1), iVar2 != 0)) &&
           (iVar2 = Fraig_NodeIsEquivalent(p,p->pConst1,pFVar5,-1,p->nSeconds), iVar2 != 0)) {
          uVar1 = *(uint *)(p->vOutputs->pArray + lVar6);
          uVar3 = Fraig_NodeComparePhase(p->pConst1,pFVar5);
          pFVar5 = (Fraig_Node_t *)((ulong)p->pConst1 ^ 1);
          if ((uVar1 & 1) == uVar3) {
            pFVar5 = p->pConst1;
          }
          p->vOutputs->pArray[lVar6] = pFVar5;
        }
        lVar6 = lVar6 + 1;
        pFVar4 = p->vOutputs;
      } while (lVar6 < pFVar4->nSize);
    }
  }
  return;
}

Assistant:

void Fraig_ManProveMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    abctime clk;

    if ( !p->fTryProve )
        return;
 
    clk = Abc_Clock();
    // consider all outputs of the multi-output miter
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        pNode = Fraig_Regular(p->vOutputs->pArray[i]);
        // skip already constant nodes
        if ( pNode == p->pConst1 )
            continue;
        // skip nodes that are different according to simulation
        if ( !Fraig_CompareSimInfo( pNode, p->pConst1, p->nWordsRand, 1 ) )
            continue;
        if ( Fraig_NodeIsEquivalent( p, p->pConst1, pNode, -1, p->nSeconds ) )
        {
            if ( Fraig_IsComplement(p->vOutputs->pArray[i]) ^ Fraig_NodeComparePhase(p->pConst1, pNode) )
                p->vOutputs->pArray[i] = Fraig_Not(p->pConst1);
            else
                p->vOutputs->pArray[i] = p->pConst1;
        }
    }
    if ( p->fVerboseP ) 
    {
//        ABC_PRT( "Final miter proof time", Abc_Clock() - clk );
    }
}